

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.hpp
# Opt level: O0

uint64_t fibonacci(uint64_t n)

{
  uint64_t uVar1;
  uint64_t c;
  uint64_t i;
  uint64_t b;
  uint64_t a;
  uint64_t n_local;
  
  b = 1;
  i = 1;
  for (c = 3; c <= n; c = c + 1) {
    uVar1 = b + i;
    b = i;
    i = uVar1;
  }
  return i;
}

Assistant:

uint64_t fibonacci(uint64_t n)
{
    uint64_t a = 1, b = 1;
    for (uint64_t i = 3; i <= n; ++i)
    {
        uint64_t c = a + b;
        a = b;
        b = c;
    }
    return b;
}